

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

wchar_t hex_str_to_int(char *s)

{
  char cVar1;
  int iVar2;
  wchar_t wVar3;
  
  wVar3 = L'\0';
  do {
    cVar1 = *s;
    iVar2 = (int)cVar1;
    if (cVar1 == '\0') {
      return wVar3;
    }
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar2 = iVar2 + -0x30;
    }
    else if ((byte)(cVar1 + 0xbfU) < 6) {
      iVar2 = iVar2 + -0x37;
    }
    else {
      iVar2 = iVar2 + -0x57;
      if (5 < (byte)(cVar1 + 0x9fU)) {
        iVar2 = -1;
      }
    }
    wVar3 = wVar3 * 0x10 + iVar2;
    s = s + 1;
  } while (iVar2 != -1);
  return L'\xffffffff';
}

Assistant:

int hex_str_to_int(const char *s) {
	int result = 0;
	while (*s) {
		int current = hex_char_to_int(*s);
		if (current == -1)
			return -1;
		result *= 16;
		result += current;
		++s;
	}
	return result;
}